

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regerror.c
# Opt level: O2

size_t regerror(int __errcode,regex_t *__preg,char *__errbuf,size_t __errbuf_size)

{
  uint uVar1;
  int iVar2;
  rerr *prVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  rerr *prVar7;
  char convbuf [50];
  
  if (__errcode == 0xff) {
    if ((__preg != (regex_t *)0x0) && (pcVar6 = (char *)__preg->used, pcVar6 != (char *)0x0)) {
      prVar7 = rerrs;
      do {
        uVar5 = prVar7->code;
        if ((int)uVar5 < 0) goto LAB_00105805;
        iVar2 = strcmp(prVar7->name,pcVar6);
        prVar7 = prVar7 + 1;
      } while (iVar2 != 0);
      pcVar6 = "%d";
LAB_0010583a:
      snprintf(convbuf,0x32,pcVar6,(ulong)uVar5);
      sVar4 = set_result(__errbuf,__errbuf_size,convbuf);
      return sVar4;
    }
LAB_00105805:
    pcVar6 = "0";
  }
  else {
    uVar5 = __errcode & 0xfffffeff;
    prVar7 = rerrs;
    do {
      prVar3 = prVar7;
      uVar1 = prVar3->code;
      if ((int)uVar1 < 0) break;
      prVar7 = prVar3 + 1;
    } while (uVar1 != uVar5);
    if (((uint)__errcode >> 8 & 1) == 0) {
      pcVar6 = prVar3->explain;
    }
    else {
      if ((int)uVar1 < 0) {
        pcVar6 = "REG_0x%x";
        goto LAB_0010583a;
      }
      pcVar6 = prVar3->name;
    }
  }
  sVar4 = set_result(__errbuf,__errbuf_size,pcVar6);
  return sVar4;
}

Assistant:

size_t
regerror(int errorcode, const regex_t *preg, char *errbuf, size_t errbuf_size)
{
	struct rerr *r;
	char convbuf[50];

	if (errorcode == REG_ATOI) {
		if (preg == NULL || preg->re_endp == NULL)
			return set_result(errbuf, errbuf_size, "0");
		for (r = rerrs; r->code >= 0; r++)
			if (strcmp(r->name, preg->re_endp) == 0)
				break;
		if (r->code < 0)
			return set_result(errbuf, errbuf_size, "0");
		snprintf(convbuf, sizeof convbuf, "%d", r->code);
		return set_result(errbuf, errbuf_size, convbuf);
	}
	else {
		int target = errorcode &~ REG_ITOA;
		
		for (r = rerrs; r->code >= 0; r++)
			if (r->code == target)
				break;
		if (errorcode & REG_ITOA) {
			if (r->code >= 0)
				return set_result(errbuf, errbuf_size, r->name);
			snprintf(convbuf, sizeof convbuf, "REG_0x%x", target);
			return set_result(errbuf, errbuf_size, convbuf);
		}
		return set_result(errbuf, errbuf_size, r->explain);
	}
}